

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<Teacher,_std::allocator<Teacher>_> *
GetRandomSubsetOfTeachers
          (vector<Teacher,_std::allocator<Teacher>_> *__return_storage_ptr__,
          vector<Teacher,_std::allocator<Teacher>_> *teachers)

{
  vector<Teacher,_std::allocator<Teacher>_> local_30;
  vector<Teacher,_std::allocator<Teacher>_> *local_18;
  vector<Teacher,_std::allocator<Teacher>_> *teachers_local;
  
  local_18 = teachers;
  teachers_local = __return_storage_ptr__;
  std::vector<Teacher,_std::allocator<Teacher>_>::vector(&local_30,teachers);
  GetRandomSubset<Teacher>(__return_storage_ptr__,&local_30,7);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

static vector<Teacher> GetRandomSubsetOfTeachers(const vector<Teacher>& teachers) {
    return GetRandomSubset(teachers, TEACHERS_PER_SUBJECT);
}